

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::anon_unknown_24::IsValidLowerSnakeCaseName
          (anon_unknown_24 *this,string_view name,string *error)

{
  bool bVar1;
  LogMessage *pLVar2;
  const_iterator pvVar3;
  uchar *puVar4;
  char *extraout_RDX;
  string_view name_00;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  CharSet kLowerSnakeCaseChars;
  LogMessage local_40;
  Voidify local_29;
  string *local_28;
  string *error_local;
  string_view name_local;
  
  local_28 = (string *)name._M_str;
  name_local._M_len = name._M_len;
  error_local = (string *)this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&error_local);
  if (bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x23e3,"!name.empty()");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  __range2 = (string_view *)0x3ff400000000000;
  kLowerSnakeCaseChars.m_[0] = 0x7fffffe80000000;
  kLowerSnakeCaseChars.m_[1] = 0;
  kLowerSnakeCaseChars.m_[2] = 0;
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&error_local);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&error_local);
  while( true ) {
    if (__end2 == pvVar3) {
      puVar4 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&error_local,
                                   0);
      bVar1 = absl::lts_20250127::ascii_islower(*puVar4);
      if (bVar1) {
        name_00._M_str = extraout_RDX;
        name_00._M_len = name_local._M_len;
        bVar1 = ContainsBadUnderscores((anon_unknown_24 *)error_local,name_00);
        if (bVar1) {
          std::__cxx11::string::operator=(local_28,"contains style violating underscores");
          name_local._M_str._7_1_ = false;
        }
        else {
          name_local._M_str._7_1_ = true;
        }
      }
      else {
        std::__cxx11::string::operator=(local_28,"should begin with a lower case letter");
        name_local._M_str._7_1_ = false;
      }
      return name_local._M_str._7_1_;
    }
    bVar1 = absl::lts_20250127::CharSet::contains((CharSet *)&__range2,*__end2);
    if (!bVar1) break;
    __end2 = __end2 + 1;
  }
  std::__cxx11::string::operator=(local_28,"should be lower_snake_case");
  return false;
}

Assistant:

bool IsValidLowerSnakeCaseName(absl::string_view name, std::string* error) {
  ABSL_CHECK(!name.empty());

  constexpr absl::CharSet kLowerSnakeCaseChars =
      absl::CharSet::Range('a', 'z') | absl::CharSet::Range('0', '9') |
      absl::CharSet::Char('_') | absl::CharSet::Char('.');
  for (char c : name) {
    if (!kLowerSnakeCaseChars.contains(c)) {
      *error = "should be lower_snake_case";
      return false;
    }
  }
  if (!absl::ascii_islower(name[0])) {
    *error = "should begin with a lower case letter";
    return false;
  }
  if (ContainsBadUnderscores(name)) {
    *error = "contains style violating underscores";
    return false;
  }
  return true;
}